

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeCompare(Parse *pParse,Expr *pLeft,Expr *pRight,int opcode,int in1,int in2,int dest,
               int jumpIfNull)

{
  byte bVar1;
  int iVar2;
  CollSeq *zP4;
  CollSeq *p4;
  int addr;
  int p5;
  int in2_local;
  int in1_local;
  int opcode_local;
  Expr *pRight_local;
  Expr *pLeft_local;
  Parse *pParse_local;
  
  zP4 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pRight);
  bVar1 = binaryCompareP5(pLeft,pRight,jumpIfNull);
  iVar2 = sqlite3VdbeAddOp4(pParse->pVdbe,opcode,in2,dest,in1,(char *)zP4,-2);
  sqlite3VdbeChangeP5(pParse->pVdbe,(ushort)bVar1);
  return iVar2;
}

Assistant:

static int codeCompare(
  Parse *pParse,    /* The parsing (and code generating) context */
  Expr *pLeft,      /* The left operand */
  Expr *pRight,     /* The right operand */
  int opcode,       /* The comparison opcode */
  int in1, int in2, /* Register holding operands */
  int dest,         /* Jump here if true.  */
  int jumpIfNull    /* If true, jump if either operand is NULL */
){
  int p5;
  int addr;
  CollSeq *p4;

  p4 = sqlite3BinaryCompareCollSeq(pParse, pLeft, pRight);
  p5 = binaryCompareP5(pLeft, pRight, jumpIfNull);
  addr = sqlite3VdbeAddOp4(pParse->pVdbe, opcode, in2, dest, in1,
                           (void*)p4, P4_COLLSEQ);
  sqlite3VdbeChangeP5(pParse->pVdbe, (u8)p5);
  return addr;
}